

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O3

Vec_Int_t * Exp_And(int *pMan,int nVars,Vec_Int_t *p0,Vec_Int_t *p1,int fCompl0,int fCompl1)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p;
  int *piVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  undefined4 in_register_00000034;
  long lVar10;
  int iVar11;
  
  lVar10 = CONCAT44(in_register_00000034,nVars);
  uVar1 = *(uint *)(lVar10 + 4);
  uVar2 = p0->nSize;
  iVar11 = uVar1 + uVar2 + 1;
  p = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < uVar2 + uVar1) {
    iVar5 = iVar11;
  }
  p->nSize = 0;
  p->nCap = iVar5;
  if (iVar5 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar5 << 2);
  }
  p->pArray = piVar4;
  if ((uVar1 & uVar2 & 1) == 0) {
    __assert_fail("(Len0 & 1) && (Len1 & 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mio/exp.h"
                  ,0x8b,"Vec_Int_t *Exp_And(int *, int, Vec_Int_t *, Vec_Int_t *, int, int)");
  }
  Vec_IntPush(p,((uVar1 - ((int)uVar1 >> 0x1f) >> 1) + (int)pMan + (int)uVar2 / 2) * 2);
  if (0 < *(int *)(lVar10 + 4)) {
    uVar6 = (uint)p1 ^ **(uint **)(lVar10 + 8);
    iVar5 = (int)pMan * 2;
    iVar3 = ((int)uVar2 / 2) * 2;
    iVar8 = 0;
    if (iVar5 <= (int)uVar6) {
      iVar8 = iVar3;
    }
    Vec_IntPush(p,iVar8 + uVar6);
    if (0 < p0->nSize) {
      Vec_IntPush(p,fCompl0 ^ *p0->pArray);
      if (1 < (int)uVar1) {
        uVar7 = 1;
        do {
          if ((long)*(int *)(lVar10 + 4) <= (long)uVar7) goto LAB_008c8872;
          iVar8 = *(int *)(*(long *)(lVar10 + 8) + uVar7 * 4);
          iVar9 = iVar3;
          if (iVar8 < iVar5) {
            iVar9 = 0;
          }
          Vec_IntPush(p,iVar9 + iVar8);
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
      }
      if (1 < (int)uVar2) {
        uVar7 = 1;
        do {
          if ((long)p0->nSize <= (long)uVar7) goto LAB_008c8872;
          Vec_IntPush(p,p0->pArray[uVar7]);
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
      }
      if (p->nSize == iVar11) {
        return p;
      }
      __assert_fail("Vec_IntSize(r) == Len0 + Len1 + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mio/exp.h"
                    ,0x93,"Vec_Int_t *Exp_And(int *, int, Vec_Int_t *, Vec_Int_t *, int, int)");
    }
  }
LAB_008c8872:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline Vec_Int_t * Exp_And( int * pMan, int nVars, Vec_Int_t * p0, Vec_Int_t * p1, int fCompl0, int fCompl1 )
{
    int i, Len0 = Vec_IntSize(p0), Len1 = Vec_IntSize(p1);
    Vec_Int_t * r = Vec_IntAlloc( Len0 + Len1 + 1 );
    assert( (Len0 & 1) && (Len1 & 1) );
    Vec_IntPush( r, 2 * (nVars + Len0/2 + Len1/2) );
    Vec_IntPush( r, Exp_LitShift( nVars, Vec_IntEntry(p0, 0) ^ fCompl0, Len1/2 ) );
    Vec_IntPush( r, Vec_IntEntry(p1, 0) ^ fCompl1 );
    for ( i = 1; i < Len0; i++ )
        Vec_IntPush( r, Exp_LitShift( nVars, Vec_IntEntry(p0, i), Len1/2 ) );
    for ( i = 1; i < Len1; i++ )
        Vec_IntPush( r, Vec_IntEntry(p1, i) );
    assert( Vec_IntSize(r) == Len0 + Len1 + 1 );
    return r;
}